

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * __thiscall
CPP::WriteInitialization::pixCall
          (QString *__return_storage_ptr__,WriteInitialization *this,QLatin1StringView t,
          QString *text)

{
  long lVar1;
  Uic *pUVar2;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  _string<false> local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QArrayDataPointer<char16_t> local_60;
  QLatin1StringView t_local;
  
  t_local.m_data = t.m_data;
  t_local.m_size = t.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) {
    local_60.d = (Data *)&t_local;
    local_60.ptr = (char16_t *)0x2;
    local_60.size = 0x16f5e5;
    QStringBuilder<QLatin1String_&,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,(QStringBuilder<QLatin1String_&,_QLatin1String> *)&local_60);
  }
  else {
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_78,__return_storage_ptr__,3);
    QTextStream::operator<<((QTextStream *)&local_78,t);
    QTextStream::operator<<((QTextStream *)&local_78,'(');
    pUVar2 = this->m_uic;
    local_60.d = (pUVar2->pixFunction).d.d;
    local_60.ptr = (pUVar2->pixFunction).d.ptr;
    local_60.size = (pUVar2->pixFunction).d.size;
    if ((QLatin1StringView *)local_60.d != (QLatin1StringView *)0x0) {
      LOCK();
      *(int *)&((QLatin1StringView *)local_60.d)->m_size =
           (int)((QLatin1StringView *)local_60.d)->m_size + 1;
      UNLOCK();
    }
    local_88.m_value = text;
    if ((char *)local_60.size == (char *)0x0) {
      local_88.m_indent = &this->m_dindent;
      language::_string<true>::format((_string<true> *)&local_88,(QTextStream *)&local_78);
    }
    else {
      pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_78,(QString *)&local_60)
      ;
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'(');
      local_88.m_indent = &this->m_dindent;
      language::_string<false>::format(&local_88,pQVar3);
      QTextStream::operator<<(pQVar3,')');
    }
    QTextStream::operator<<((QTextStream *)&local_78,')');
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QTextStream::~QTextStream((QTextStream *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::pixCall(QLatin1StringView t, const QString &text) const
{
    if (text.isEmpty())
        return t % "()"_L1;

    QString result;
    QTextStream str(&result);
    str << t;
    str << '(';
    const QString pixFunc = m_uic->pixmapFunction();
    if (pixFunc.isEmpty())
        str << language::qstring(text, m_dindent);
    else
        str << pixFunc << '(' << language::charliteral(text, m_dindent) << ')';
    str << ')';
    return result;
}